

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Recorder.h
# Opt level: O3

void __thiscall chrono::ChRecPoint::ArchiveOUT(ChRecPoint *this,ChArchiveOut *marchive)

{
  char *local_38;
  ChRecPoint *local_30;
  undefined1 local_28;
  
  local_38 = "x";
  local_28 = 0;
  local_30 = this;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = (ChRecPoint *)&this->y;
  local_38 = "y";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = (ChRecPoint *)&this->w;
  local_38 = "w";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ArchiveOUT(ChArchiveOut& marchive) {
        marchive << CHNVP(x);
        marchive << CHNVP(y);
        marchive << CHNVP(w);
    }